

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtabwidget.cpp
# Opt level: O3

void QTabWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  TabPosition TVar1;
  TabShape TVar2;
  QSize *pQVar3;
  code *pcVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  TextElideMode TVar8;
  QTabWidgetPrivate *d;
  undefined8 *puVar9;
  QSize QVar10;
  QTabBar *this;
  QTabWidgetPrivate *this_00;
  long in_FS_OFFSET;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_2c = *_a[1];
      iVar7 = 0;
      break;
    case 1:
      local_2c = *_a[1];
      iVar7 = 1;
      break;
    case 2:
      local_2c = *_a[1];
      iVar7 = 2;
      break;
    case 3:
      local_2c = *_a[1];
      iVar7 = 3;
      break;
    case 4:
      iVar7 = *_a[1];
LAB_004abfba:
      this = *(QTabBar **)(*(long *)(_o + 8) + 600);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
LAB_004abfd9:
        QTabBar::setCurrentIndex(this,iVar7);
        return;
      }
      goto LAB_004ac217;
    case 5:
      this = *(QTabBar **)(*(long *)(_o + 8) + 600);
      iVar7 = QStackedWidget::indexOf(*(QStackedWidget **)(*(long *)(_o + 8) + 0x260),*_a[1]);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_004ac217;
      goto LAB_004abfd9;
    default:
      goto switchD_004abd84_caseD_3;
    }
    local_20 = &local_2c;
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar7,&local_28);
    break;
  case ReadProperty:
    if (10 < (uint)_id) break;
    pQVar3 = (QSize *)*_a;
    switch(_id) {
    case 0:
      TVar8 = *(TextElideMode *)(*(long *)(_o + 8) + 0x27c);
      break;
    case 1:
      TVar8 = *(TextElideMode *)(*(long *)(_o + 8) + 0x280);
      break;
    case 2:
      TVar8 = QTabBar::currentIndex(*(QTabBar **)(*(long *)(_o + 8) + 600));
      break;
    case 3:
      TVar8 = QTabBar::count(*(QTabBar **)(*(long *)(_o + 8) + 600));
      break;
    case 4:
      QVar10 = QTabBar::iconSize(*(QTabBar **)(*(long *)(_o + 8) + 600));
      *pQVar3 = QVar10;
      goto switchD_004abd84_caseD_3;
    case 5:
      TVar8 = QTabBar::elideMode(*(QTabBar **)(*(long *)(_o + 8) + 600));
      break;
    case 6:
      bVar6 = QTabBar::usesScrollButtons(*(QTabBar **)(*(long *)(_o + 8) + 600));
      goto LAB_004ac1f9;
    case 7:
      if (*(QTabBar **)(*(long *)(_o + 8) + 600) == (QTabBar *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = QTabBar::documentMode(*(QTabBar **)(*(long *)(_o + 8) + 600));
      }
      *(bool *)&(pQVar3->wd).m_i = bVar6;
      goto switchD_004abd84_caseD_3;
    case 8:
      bVar6 = QTabBar::tabsClosable(*(QTabBar **)(*(long *)(_o + 8) + 600));
      goto LAB_004ac1f9;
    case 9:
      bVar6 = QTabBar::isMovable(*(QTabBar **)(*(long *)(_o + 8) + 600));
      goto LAB_004ac1f9;
    case 10:
      bVar6 = QTabBar::autoHide(*(QTabBar **)(*(long *)(_o + 8) + 600));
LAB_004ac1f9:
      *(bool *)&(pQVar3->wd).m_i = bVar6;
      goto switchD_004abd84_caseD_3;
    }
    (pQVar3->wd).m_i = TVar8;
    break;
  case WriteProperty:
    if (10 < (uint)_id) break;
    pQVar3 = (QSize *)*_a;
    switch(_id) {
    case 0:
      TVar1 = (pQVar3->wd).m_i;
      this_00 = *(QTabWidgetPrivate **)(_o + 8);
      if (this_00->pos != TVar1) {
        this_00->pos = TVar1;
LAB_004ac029:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          QTabWidgetPrivate::updateTabBarPosition(this_00);
          return;
        }
        break;
      }
      goto switchD_004abd84_caseD_3;
    case 1:
      TVar2 = (pQVar3->wd).m_i;
      this_00 = *(QTabWidgetPrivate **)(_o + 8);
      if (this_00->shape != TVar2) {
        this_00->shape = TVar2;
        goto LAB_004ac029;
      }
      goto switchD_004abd84_caseD_3;
    case 2:
      iVar7 = (pQVar3->wd).m_i;
      goto LAB_004abfba;
    case 3:
      goto switchD_004abd84_caseD_3;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QTabBar::setIconSize(*(QTabBar **)(*(long *)(_o + 8) + 600),pQVar3);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QTabBar::setElideMode(*(QTabBar **)(*(long *)(_o + 8) + 600),(pQVar3->wd).m_i);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QTabBar::setUsesScrollButtons
                  (*(QTabBar **)(*(long *)(_o + 8) + 600),SUB41((pQVar3->wd).m_i,0));
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setDocumentMode((QTabWidget *)_o,SUB41((pQVar3->wd).m_i,0));
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setTabsClosable((QTabWidget *)_o,SUB41((pQVar3->wd).m_i,0));
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QTabBar::setMovable(*(QTabBar **)(*(long *)(_o + 8) + 600),SUB41((pQVar3->wd).m_i,0));
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QTabBar::setAutoHide(*(QTabBar **)(*(long *)(_o + 8) + 600),SUB41((pQVar3->wd).m_i,0));
        return;
      }
    }
    goto LAB_004ac217;
  case IndexOfMethod:
    pcVar4 = *_a[1];
    lVar5 = *(long *)((long)_a[1] + 8);
    if (pcVar4 == currentChanged && lVar5 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar4 == tabCloseRequested && lVar5 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar4 == tabBarClicked && lVar5 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar4 == tabBarDoubleClicked && lVar5 == 0) {
      *(undefined4 *)*_a = 3;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 5) {
      puVar9 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar9 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        break;
      }
    }
    else {
      puVar9 = (undefined8 *)*_a;
    }
    *puVar9 = 0;
  }
switchD_004abd84_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_004ac217:
  __stack_chk_fail();
}

Assistant:

void QTabWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTabWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->tabCloseRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->tabBarClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->tabBarDoubleClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setCurrentWidget((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::currentChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::tabCloseRequested, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::tabBarClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::tabBarDoubleClicked, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<TabPosition*>(_v) = _t->tabPosition(); break;
        case 1: *reinterpret_cast<TabShape*>(_v) = _t->tabShape(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 4: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 5: *reinterpret_cast<Qt::TextElideMode*>(_v) = _t->elideMode(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->usesScrollButtons(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->tabsClosable(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->isMovable(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->tabBarAutoHide(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTabPosition(*reinterpret_cast<TabPosition*>(_v)); break;
        case 1: _t->setTabShape(*reinterpret_cast<TabShape*>(_v)); break;
        case 2: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 5: _t->setElideMode(*reinterpret_cast<Qt::TextElideMode*>(_v)); break;
        case 6: _t->setUsesScrollButtons(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setTabsClosable(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setMovable(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setTabBarAutoHide(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}